

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tle.h
# Opt level: O1

void __thiscall libsgp4::Tle::Tle(Tle *this,string *name,string *line_one,string *line_two)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar4;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar3;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->line_one_).field_2;
  (this->line_one_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (line_one->_M_dataplus)._M_p;
  paVar2 = &line_one->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&line_one->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->line_one_).field_2 + 8) = uVar4;
  }
  else {
    (this->line_one_)._M_dataplus._M_p = pcVar3;
    (this->line_one_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->line_one_)._M_string_length = line_one->_M_string_length;
  (line_one->_M_dataplus)._M_p = (pointer)paVar2;
  line_one->_M_string_length = 0;
  (line_one->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->line_two_).field_2;
  (this->line_two_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (line_two->_M_dataplus)._M_p;
  paVar2 = &line_two->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&line_two->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->line_two_).field_2 + 8) = uVar4;
  }
  else {
    (this->line_two_)._M_dataplus._M_p = pcVar3;
    (this->line_two_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->line_two_)._M_string_length = line_two->_M_string_length;
  (line_two->_M_dataplus)._M_p = (pointer)paVar2;
  line_two->_M_string_length = 0;
  (line_two->field_2)._M_local_buf[0] = '\0';
  (this->int_designator_)._M_dataplus._M_p = (pointer)&(this->int_designator_).field_2;
  (this->int_designator_)._M_string_length = 0;
  (this->int_designator_).field_2._M_local_buf[0] = '\0';
  (this->epoch_).m_encoded = 0;
  DateTime::Initialise(&this->epoch_,1,1,1,0,0,0,0);
  this->mean_motion_ = 0.0;
  this->norad_number_ = 0;
  this->orbit_number_ = 0;
  this->argument_perigee_ = 0.0;
  this->mean_anomaly_ = 0.0;
  this->right_ascending_node_ = 0.0;
  this->eccentricity_ = 0.0;
  this->bstar_ = 0.0;
  this->inclination_ = 0.0;
  this->mean_motion_dt2_ = 0.0;
  this->mean_motion_ddt6_ = 0.0;
  Initialize(this);
  return;
}

Assistant:

Tle(std::string name, std::string line_one, std::string line_two)
        : name_(std::move(name))
        , line_one_(std::move(line_one))
        , line_two_(std::move(line_two))
    {
        Initialize();
    }